

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

void __thiscall
CommandLineArguments::AddExcludeStrictNameFilter
          (CommandLineArguments *this,int ac,char **av,int *index)

{
  TestFilter *pTVar1;
  undefined8 in_RCX;
  CommandLineArguments *in_RDX;
  undefined4 in_ESI;
  SimpleString *in_RDI;
  TestFilter *nameFilter;
  char *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffa0;
  SimpleString *in_stack_ffffffffffffffc8;
  int *in_stack_ffffffffffffffd0;
  char **in_stack_ffffffffffffffd8;
  int ac_00;
  
  ac_00 = (int)((ulong)in_RCX >> 0x20);
  pTVar1 = (TestFilter *)operator_new((size_t)in_RDI,in_stack_ffffffffffffff88,0);
  SimpleString::SimpleString(in_RDI,in_stack_ffffffffffffff88);
  getParameterField(in_RDX,ac_00,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffc8);
  TestFilter::TestFilter((TestFilter *)CONCAT44(in_ESI,in_stack_ffffffffffffffa0),&pTVar1->filter_);
  SimpleString::~SimpleString((SimpleString *)0x21d194);
  SimpleString::~SimpleString((SimpleString *)0x21d19e);
  TestFilter::invertMatching(pTVar1);
  TestFilter::strictMatching(pTVar1);
  pTVar1 = TestFilter::add(pTVar1,(TestFilter *)in_RDI[6].buffer_);
  in_RDI[6].buffer_ = (char *)pTVar1;
  return;
}

Assistant:

void CommandLineArguments::AddExcludeStrictNameFilter(int ac, const char** av, int& index)
{
    TestFilter* nameFilter = new TestFilter(getParameterField(ac, av, index, "-xsn"));
    nameFilter->invertMatching();
    nameFilter->strictMatching();
    nameFilters_= nameFilter->add(nameFilters_);
}